

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O2

TPZGeoEl * __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoTriangle>::SubElement
          (TPZGeoElRefLess<pzgeom::TPZGeoTriangle> *this,int is)

{
  ostream *poVar1;
  
  if (1 < (uint)is) {
    poVar1 = std::operator<<((ostream *)&std::cout,"TPZGeoElRefLess::SubElement index error is= ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,is);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  return (TPZGeoEl *)0x0;
}

Assistant:

TPZGeoEl *
TPZGeoElRefLess<TGeo>::SubElement(int is) const {
	if(is<0 || is>1){//(TRef::NSubEl - 1)){
		std::cout << "TPZGeoElRefLess::SubElement index error is= " << is << std::endl;
	}
	//  return fSubEl[is];
	return 0;
}